

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ostream * Catch::operator<<(ostream *os,pluralise *pluraliser)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar1 = std::operator<<(poVar1,' ');
  std::operator<<(poVar1,(string *)&pluraliser->m_label);
  if (pluraliser->m_count != 1) {
    std::operator<<(os,'s');
  }
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, pluralise const &pluraliser) {
        os << pluraliser.m_count << ' ' << pluraliser.m_label;
        if (pluraliser.m_count != 1)
            os << 's';
        return os;
    }